

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O3

void kratos::VarSourceVisitor::get_source_var
               (Var *var,
               unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
               *set)

{
  __node_base_ptr *__src;
  undefined1 local_a8 [8];
  VarComponentVisitor visitor;
  
  if ((var->type_ != ConstValue) && (var->type_ != Parameter)) {
    visitor.super_IRVisitor._8_8_ =
         &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
    visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
    visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
    local_a8 = (undefined1  [8])&PTR_visit_root_002d7f08;
    visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
         (__node_base_ptr)&visitor.vars_._M_h._M_rehash_policy._M_next_resize;
    visitor.vars_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.vars_._M_h._M_bucket_count = 0;
    visitor.vars_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.vars_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.vars_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.vars_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.vars_._M_h._M_rehash_policy._M_next_resize = 0;
    IRVisitor::visit_root((IRVisitor *)local_a8,&var->super_IRNode);
    __src = &visitor.super_IRVisitor.visited_._M_h._M_single_bucket;
    std::
    _Hashtable<kratos::Var*,kratos::Var*,std::allocator<kratos::Var*>,std::__detail::_Identity,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_merge_unique<std::_Hashtable<kratos::Var*,kratos::Var*,std::allocator<kratos::Var*>,std::__detail::_Identity,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>>
              ((_Hashtable<kratos::Var*,kratos::Var*,std::allocator<kratos::Var*>,std::__detail::_Identity,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)set,(_Hashtable<kratos::Var_*,_kratos::Var_*,_std::allocator<kratos::Var_*>,_std::__detail::_Identity,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)__src);
    local_a8 = (undefined1  [8])&PTR_visit_root_002d7f08;
    std::
    _Hashtable<kratos::Var_*,_kratos::Var_*,_std::allocator<kratos::Var_*>,_std::__detail::_Identity,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<kratos::Var_*,_kratos::Var_*,_std::allocator<kratos::Var_*>,_std::__detail::_Identity,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)__src);
    local_a8 = (undefined1  [8])&PTR_visit_root_002d62a8;
    std::
    _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&visitor.super_IRVisitor.level);
  }
  return;
}

Assistant:

void static get_source_var(const Var *var, std::unordered_set<Var *> &set) {
        if (var->type() == VarType::ConstValue || var->type() == VarType::Parameter) return;
        VarComponentVisitor visitor;
        visitor.visit_root(const_cast<Var *>(var));
        set.merge(visitor.vars());
    }